

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

void __thiscall
adios2::query::QueryBase::ApplyOutputRegion
          (QueryBase *this,
          vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *touchedBlocks,Box<Dims> *referenceRegion)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *p_Var5;
  pointer this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  long in_RDI;
  size_t k_1;
  iterator it;
  size_t k;
  bool isDifferent;
  Dims diff;
  vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_ffffffffffffff58;
  __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *in_stack_ffffffffffffff60;
  __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *in_stack_ffffffffffffff68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  ulong uVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *local_68;
  __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_58;
  undefined4 local_4c;
  ulong local_48;
  byte local_3d;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  
  local_18 = in_RDX;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8));
  if (sVar2 != 0) {
    this_01 = &local_30;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd27fbf);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (this_01,in_stack_ffffffffffffff78);
    local_3d = 0;
    local_48 = 0;
    while (uVar6 = local_48,
          sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8)),
          uVar6 < sVar2) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),
                          local_48);
      in_stack_ffffffffffffff68 =
           (__normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            *)*pvVar3;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_18,local_48);
      in_stack_ffffffffffffff70 =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           ((long)in_stack_ffffffffffffff68 - *pvVar4);
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_30,local_48);
      *pvVar3 = (value_type)in_stack_ffffffffffffff70;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_30,local_48);
      if (*pvVar3 != 0) {
        local_3d = 1;
      }
      local_48 = local_48 + 1;
    }
    if ((local_3d & 1) == 0) {
      local_4c = 1;
    }
    else {
      local_58._M_current =
           (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            *)std::
              vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::begin(in_stack_ffffffffffffff58);
      while( true ) {
        std::
        vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::end(in_stack_ffffffffffffff58);
        bVar1 = __gnu_cxx::operator!=
                          (in_stack_ffffffffffffff60,
                           (__normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            *)in_stack_ffffffffffffff58);
        if (!bVar1) break;
        local_68 = (__normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    *)0x0;
        while (in_stack_ffffffffffffff60 = local_68,
              p_Var5 = (__normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     (in_RDI + 8)), in_stack_ffffffffffffff60 < p_Var5) {
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_30,(size_type)local_68);
          in_stack_ffffffffffffff58 =
               (vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                *)*pvVar3;
          this_00 = __gnu_cxx::
                    __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::operator->(&local_58);
          pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this_00->first,(size_type)local_68);
          *pvVar3 = (long)&(in_stack_ffffffffffffff58->
                           super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + *pvVar3;
          local_68 = (__normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      *)((long)&local_68->_M_current + 1);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::operator++(in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      }
      local_4c = 0;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void QueryBase::ApplyOutputRegion(std::vector<Box<Dims>> &touchedBlocks,
                                  const adios2::Box<Dims> &referenceRegion)
{
    if (m_OutputRegion.first.size() == 0)
        return;

    adios2::Dims diff;
    diff.resize(m_OutputRegion.first.size());
    bool isDifferent = false;
    for (size_t k = 0; k < m_OutputRegion.first.size(); k++)
    {
        diff[k] = m_OutputRegion.first[k] - referenceRegion.first[k];
        if (diff[k] != 0)
            isDifferent = true;
    }

    if (!isDifferent)
        return;

    // blocks are usually part of the reference region
    for (auto it = touchedBlocks.begin(); it != touchedBlocks.end(); it++)
    {
        for (size_t k = 0; k < m_OutputRegion.first.size(); k++)
            it->first[k] += diff[k];
    }
}